

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O3

string * r_code::Utils::GetString<r_code::Code>
                   (string *__return_storage_ptr__,Code *object,uint16_t index)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar3;
  size_t sVar4;
  undefined6 in_register_00000012;
  ulong uVar5;
  ulong uVar6;
  char buffer [255];
  char local_128 [256];
  
  (*(object->super__Object)._vptr__Object[5])
            (object,CONCAT62(in_register_00000012,index) & 0xffffffff);
  uVar1 = r_code::Atom::asIndex();
  iVar2 = (*(object->super__Object)._vptr__Object[5])(object,(ulong)(ushort)uVar1);
  uVar6 = (ulong)*(byte *)CONCAT44(extraout_var,iVar2);
  local_128[uVar6] = '\0';
  if (uVar6 != 0) {
    uVar5 = 0;
    do {
      uVar1 = uVar1 + 1 & 0xffff;
      iVar2 = (*(object->super__Object)._vptr__Object[5])(object,(ulong)uVar1);
      uVar3 = r_code::Atom::operator_cast_to_unsigned_long((Atom *)CONCAT44(extraout_var_00,iVar2));
      *(int *)(local_128 + uVar5) = (int)uVar3;
      uVar5 = uVar5 + 4;
    } while (uVar5 < uVar6);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar4 = strlen(local_128);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_128,local_128 + sVar4);
  return __return_storage_ptr__;
}

Assistant:

static std::string GetString(const O *object, uint16_t index)
    {
        uint16_t s_index = object->code(index).asIndex();
        char buffer[255];
        uint8_t char_count = (object->code(s_index).atom & 0x000000FF);
        buffer[char_count] = 0;

        for (int i = 0; i < char_count; i += 4) {
            uint64_t val = object->code(s_index + 1 + i / 4);
            buffer[i] = (val & 0x000000ff);
            buffer[i + 1] = (val & 0x0000ff00) >> 8;
            buffer[i + 2] = (val & 0x00ff0000) >> 16;
            buffer[i + 3] = (val & 0xff000000) >> 24;
        }

        return std::string(buffer);
    }